

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcache.c
# Opt level: O2

void * duckdb_je_tcache_alloc_small_hard
                 (tsdn_t *tsdn,arena_t *arena,tcache_t *tcache,cache_bin_t *cache_bin,szind_t binind
                 ,_Bool *tcache_success)

{
  void **ppvVar1;
  tcache_slow_t *ptVar2;
  void **ppvVar3;
  ushort uVar4;
  void *pvVar5;
  _Bool _Var6;
  cache_bin_sz_t nfill;
  
  ptVar2 = tcache->tcache_slow;
  uVar4 = (cache_bin->bin_info).ncached_max >> (ptVar2->lg_fill_div[binind] & 0x1f);
  nfill = 1;
  if (uVar4 != 0) {
    nfill = uVar4;
  }
  duckdb_je_arena_cache_bin_fill_small(tsdn,arena,cache_bin,binind,nfill);
  ptVar2->bin_refilled[binind] = true;
  ppvVar3 = cache_bin->stack_head;
  pvVar5 = *ppvVar3;
  ppvVar1 = ppvVar3 + 1;
  if (cache_bin->low_bits_low_water == (uint16_t)ppvVar3) {
    if (cache_bin->low_bits_empty == cache_bin->low_bits_low_water) {
      _Var6 = false;
      pvVar5 = (void *)0x0;
      goto LAB_01fa6235;
    }
    cache_bin->stack_head = ppvVar1;
    cache_bin->low_bits_low_water = (uint16_t)ppvVar1;
  }
  else {
    cache_bin->stack_head = ppvVar1;
  }
  _Var6 = true;
LAB_01fa6235:
  *tcache_success = _Var6;
  return pvVar5;
}

Assistant:

void *
tcache_alloc_small_hard(tsdn_t *tsdn, arena_t *arena,
    tcache_t *tcache, cache_bin_t *cache_bin, szind_t binind,
    bool *tcache_success) {
	tcache_slow_t *tcache_slow = tcache->tcache_slow;
	void *ret;

	assert(tcache_slow->arena != NULL);
	assert(!tcache_bin_disabled(binind, cache_bin, tcache_slow));
	cache_bin_sz_t nfill = cache_bin_ncached_max_get(cache_bin)
	    >> tcache_slow->lg_fill_div[binind];
	if (nfill == 0) {
		nfill = 1;
	}
	arena_cache_bin_fill_small(tsdn, arena, cache_bin, binind, nfill);
	tcache_slow->bin_refilled[binind] = true;
	ret = cache_bin_alloc(cache_bin, tcache_success);

	return ret;
}